

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lf_heter_queue.h
# Opt level: O2

void __thiscall
density::
lf_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,void()>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)0,(density::concurrency_cardinality)0,(density::consistency_model)1>
::
reentrant_emplace<density_tests::LfFunctionQueueSamples<(density::function_type_erasure)1,(density::concurrency_cardinality)0,(density::concurrency_cardinality)0,(density::consistency_model)1>::func_queue_reentrant_put_samples(std::ostream&)::Func,int>
          (lf_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,void()>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)0,(density::concurrency_cardinality)0,(density::consistency_model)1>
           *this,int *i_construction_params)

{
  reentrant_put_transaction<Func> rStack_28;
  
  start_reentrant_emplace<density_tests::LfFunctionQueueSamples<(density::function_type_erasure)1,(density::concurrency_cardinality)0,(density::concurrency_cardinality)0,(density::consistency_model)1>::func_queue_reentrant_put_samples(std::ostream&)::Func,int>
            (&rStack_28,this,i_construction_params);
  lf_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
  ::reentrant_put_transaction<Func>::commit(&rStack_28);
  return;
}

Assistant:

void reentrant_emplace(CONSTRUCTION_PARAMS &&... i_construction_params)
        {
            start_reentrant_emplace<ELEMENT_TYPE>(
              std::forward<CONSTRUCTION_PARAMS>(i_construction_params)...)
              .commit();
        }